

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileLibraryTargetGenerator::WriteStaticLibraryRules(cmMakefileLibraryTargetGenerator *this)

{
  cmGeneratorTarget *pcVar1;
  cmLocalUnixMakefileGenerator3 *pcVar2;
  bool bVar3;
  char *pcVar4;
  string local_198;
  undefined1 local_178 [8];
  string extraFlags;
  string linkRuleVar;
  string linkLanguage;
  string local_110;
  undefined1 local_f0 [8];
  string extraFlags_1;
  undefined1 local_c8 [8];
  string linkRuleVar_1;
  string local_a0;
  undefined1 local_79;
  const_iterator cStack_78;
  bool resolveDeviceSymbols;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  byte local_51;
  LinkClosure *pLStack_50;
  bool hasCUDA;
  LinkClosure *closure;
  allocator local_31;
  undefined1 local_30 [8];
  string cuda_lang;
  cmMakefileLibraryTargetGenerator *this_local;
  
  cuda_lang.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_30,"CUDA",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  pLStack_50 = cmGeneratorTarget::GetLinkClosure
                         ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                          GeneratorTarget,
                          &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                           ConfigName);
  local_68._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&pLStack_50->Languages);
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&pLStack_50->Languages);
  local_60 = std::
             find<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                       (local_68,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  )local_70,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_30);
  cStack_78 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(&pLStack_50->Languages);
  local_51 = __gnu_cxx::operator!=(&local_60,&stack0xffffffffffffff88);
  pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a0,"CUDA_RESOLVE_DEVICE_SYMBOLS",
             (allocator *)(linkRuleVar_1.field_2._M_local_buf + 0xf));
  bVar3 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)(linkRuleVar_1.field_2._M_local_buf + 0xf));
  local_79 = bVar3;
  if (((local_51 & 1) != 0) && (bVar3)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_c8,"CMAKE_CUDA_DEVICE_LINK_LIBRARY",
               (allocator *)(extraFlags_1.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(extraFlags_1.field_2._M_local_buf + 0xf));
    std::__cxx11::string::string((string *)local_f0);
    pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_110,"LINK_FLAGS",
               (allocator *)(linkLanguage.field_2._M_local_buf + 0xf));
    pcVar4 = cmGeneratorTarget::GetProperty(pcVar1,&local_110);
    (*(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[7])
              (pcVar2,local_f0,pcVar4);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator((allocator<char> *)(linkLanguage.field_2._M_local_buf + 0xf));
    WriteDeviceLibraryRules(this,(string *)local_c8,(string *)local_f0,false);
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::~string((string *)local_c8);
  }
  cmGeneratorTarget::GetLinkerLanguage
            ((string *)((long)&linkRuleVar.field_2 + 8),
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
  cmGeneratorTarget::GetCreateRuleVariable
            ((string *)((long)&extraFlags.field_2 + 8),
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             (string *)((long)&linkRuleVar.field_2 + 8),
             &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
  std::__cxx11::string::string((string *)local_178);
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmsys::SystemTools::UpperCase
            (&local_198,
             &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
  cmLocalGenerator::GetStaticLibraryFlags
            ((cmLocalGenerator *)pcVar2,(string *)local_178,&local_198,
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  std::__cxx11::string::~string((string *)&local_198);
  WriteLibraryRules(this,(string *)((long)&extraFlags.field_2 + 8),(string *)local_178,false);
  std::__cxx11::string::~string((string *)local_178);
  std::__cxx11::string::~string((string *)(extraFlags.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(linkRuleVar.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteStaticLibraryRules()
{
  const std::string cuda_lang("CUDA");
  cmGeneratorTarget::LinkClosure const* closure =
    this->GeneratorTarget->GetLinkClosure(this->ConfigName);

  const bool hasCUDA =
    (std::find(closure->Languages.begin(), closure->Languages.end(),
               cuda_lang) != closure->Languages.end());

  const bool resolveDeviceSymbols =
    this->GeneratorTarget->GetPropertyAsBool("CUDA_RESOLVE_DEVICE_SYMBOLS");
  if (hasCUDA && resolveDeviceSymbols) {
    std::string linkRuleVar = "CMAKE_CUDA_DEVICE_LINK_LIBRARY";
    std::string extraFlags;
    this->LocalGenerator->AppendFlags(
      extraFlags, this->GeneratorTarget->GetProperty("LINK_FLAGS"));
    this->WriteDeviceLibraryRules(linkRuleVar, extraFlags, false);
  }

  std::string linkLanguage =
    this->GeneratorTarget->GetLinkerLanguage(this->ConfigName);

  std::string linkRuleVar = this->GeneratorTarget->GetCreateRuleVariable(
    linkLanguage, this->ConfigName);

  std::string extraFlags;
  this->LocalGenerator->GetStaticLibraryFlags(
    extraFlags, cmSystemTools::UpperCase(this->ConfigName),
    this->GeneratorTarget);
  this->WriteLibraryRules(linkRuleVar, extraFlags, false);
}